

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O1

void daemon_main(int listen_fd,int close_notify_fd,char *tempdir)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  int __fd;
  pthread_t tid;
  pthread_attr_t thattr;
  pthread_t pStack_68;
  pthread_attr_t local_60;
  
  lVar4 = sysconf(4);
  iVar2 = (int)lVar4;
  if (3 < iVar2) {
    do {
      __fd = iVar2 + -1;
      if (close_notify_fd != __fd && listen_fd != __fd) {
        close(__fd);
      }
      bVar1 = 4 < iVar2;
      iVar2 = __fd;
    } while (bVar1);
  }
  pthread_attr_init(&local_60);
  pthread_attr_setdetachstate(&local_60,1);
  iVar2 = pthread_create(&pStack_68,&local_60,daemon_close_notify_thread,
                         (void *)(ulong)(uint)close_notify_fd);
  if (iVar2 == 0) {
    do {
      do {
        uVar3 = accept(listen_fd,(sockaddr *)0x0,(socklen_t *)0x0);
      } while (uVar3 == 0xffffffff);
      iVar2 = pthread_create(&pStack_68,&local_60,daemon_conn_thread,(void *)(ulong)uVar3);
    } while (iVar2 == 0);
  }
  dief("pthread_create failed");
}

Assistant:

__attribute__((noreturn)) static void daemon_main(int listen_fd, int close_notify_fd, const char *tempdir)
{
    pthread_t tid;
    pthread_attr_t thattr;
    int sock_fd;

    { /* close all descriptors (except STDIN, STDOUT, STRERR, listen_fd, close_notify_fd) */
        int fd = (int)sysconf(_SC_OPEN_MAX) - 1;
        for (; fd > 2; --fd) {
            if (fd == listen_fd || fd == close_notify_fd)
                continue;
            close(fd);
        }
    }

    pthread_attr_init(&thattr);
    pthread_attr_setdetachstate(&thattr, 1);

    if (pthread_create(&tid, &thattr, daemon_close_notify_thread, (char *)NULL + close_notify_fd) != 0)
        dief("pthread_create failed");

    while (1) {
        while ((sock_fd = accept(listen_fd, NULL, NULL)) == -1)
            ;
        if (pthread_create(&tid, &thattr, daemon_conn_thread, (char *)NULL + sock_fd) != 0)
            dief("pthread_create failed");
    }
}